

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O1

void __thiscall HighsPrimalHeuristics::rootReducedCost(HighsPrimalHeuristics *this)

{
  double dVar1;
  double dVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  HighsMipSolver *pHVar4;
  HighsLp *lp;
  undefined1 auVar5 [16];
  char cVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  pair<double,_HighsDomainChange> *domchg;
  pointer ppVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double to_lower_bound;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  lurkingBounds;
  vector<double,_std::allocator<double>_> local_3e8;
  vector<double,_std::allocator<double>_> local_3d0;
  HeuristicNeighbourhood neighbourhood;
  HighsDomain localdom;
  
  HighsRedcostFixing::getLurkingBounds
            (&lurkingBounds,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->redcostfixing,
             this->mipsolver);
  lVar7 = (long)lurkingBounds.
                super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)lurkingBounds.
                super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  _Var3._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if ((ulong)((long)*(pointer *)((long)&(_Var3._M_head_impl)->integral_cols + 8) -
              *(long *)&((_Var3._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_> >> 2) <=
      (ulong)(lVar7 * -0x5555555555555552)) {
    if (lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar8 = lVar7 * -0x5555555555555555;
      iVar9 = 0;
      if (1 < uVar8) {
        iVar9 = 0;
        do {
          uVar8 = (long)uVar8 >> 1;
          iVar9 = iVar9 + 1;
        } while (1 < uVar8);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
                (lurkingBounds.
                 super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 lurkingBounds.
                 super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,iVar9,1);
    }
    HighsDomain::HighsDomain
              (&localdom,
               &((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain);
    HeuristicNeighbourhood::HeuristicNeighbourhood(&neighbourhood,this->mipsolver,&localdom);
    if (lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        lurkingBounds.
        super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var3._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      dVar13 = (_Var3._M_head_impl)->lower_bound;
      dVar1 = (_Var3._M_head_impl)->feastol;
      ppVar10 = lurkingBounds.
                super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar12 = ppVar10->first;
        cVar6 = '\x02';
        if (dVar13 + dVar1 < dVar12) {
          dVar2 = (ppVar10->second).boundval;
          iVar9 = (ppVar10->second).column;
          if ((ppVar10->second).boundtype == kLower) {
            bVar11 = localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start[iVar9] < dVar2;
          }
          else {
            bVar11 = dVar2 < localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar9];
          }
          cVar6 = '\x03';
          if (bVar11) {
            HighsDomain::changeBound(&localdom,ppVar10->second,(Reason)0xffffffff);
            do {
              HighsDomain::propagate(&localdom);
              if (localdom.infeasible_ != true) break;
              HighsDomain::conflictAnalysis
                        (&localdom,
                         &((this->mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          conflictPool);
              pHVar4 = this->mipsolver;
              _Var3._M_head_impl =
                   (pHVar4->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              dVar2 = (_Var3._M_head_impl)->lower_bound;
              to_lower_bound = dVar12;
              if (dVar12 <= dVar2) {
                to_lower_bound = dVar2;
              }
              (_Var3._M_head_impl)->lower_bound = to_lower_bound;
              if (pHVar4->submip == false) {
                if ((to_lower_bound != dVar2) || (NAN(to_lower_bound) || NAN(dVar2))) {
                  HighsMipSolverData::updatePrimalDualIntegral
                            (_Var3._M_head_impl,dVar2,to_lower_bound,
                             (_Var3._M_head_impl)->upper_bound,(_Var3._M_head_impl)->upper_bound,
                             true,true);
                }
              }
              HighsDomain::backtrack(&localdom);
              iVar9 = (int)((ulong)((long)localdom.branchPos_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)localdom.branchPos_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2);
              if (iVar9 == 0) break;
              neighbourhood.nCheckedChanges = neighbourhood.startCheckedChanges;
              if (neighbourhood.fixedCols.numElements != 0) {
                HighsHashTable<int,_void>::clear(&neighbourhood.fixedCols);
              }
            } while (iVar9 != 0);
            dVar12 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
            cVar6 = (0.5 <= dVar12) * '\x02';
          }
        }
      } while (((cVar6 == '\x03') || (cVar6 == '\0')) &&
              (ppVar10 = ppVar10 + 1,
              ppVar10 !=
              lurkingBounds.
              super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
              ._M_impl.super__Vector_impl_data._M_finish));
    }
    dVar13 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if (0.3 <= dVar13) {
      lp = this->mipsolver->model_;
      _Var3._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      std::vector<double,_std::allocator<double>_>::vector(&local_3d0,&localdom.col_lower_);
      std::vector<double,_std::allocator<double>_>::vector(&local_3e8,&localdom.col_upper_);
      auVar5 = SEXT816(0x6666666666666667) *
               SEXT816(((this->mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes
                      );
      solveSubMip(this,lp,&(_Var3._M_head_impl)->firstrootbasis,dVar13,&local_3d0,&local_3e8,500,
                  ((int)(auVar5._8_8_ >> 3) - (auVar5._12_4_ >> 0x1f)) + 200,0xc);
      if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_3d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    HighsHashTable<int,_void>::~HighsHashTable(&neighbourhood.fixedCols);
    HighsDomain::~HighsDomain(&localdom);
  }
  if (lurkingBounds.
      super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(lurkingBounds.
                    super__Vector_base<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsPrimalHeuristics::rootReducedCost() {
  std::vector<std::pair<double, HighsDomainChange>> lurkingBounds =
      mipsolver.mipdata_->redcostfixing.getLurkingBounds(mipsolver);
  if (10 * lurkingBounds.size() < mipsolver.mipdata_->integral_cols.size())
    return;
  pdqsort(lurkingBounds.begin(), lurkingBounds.end(),
          [](const std::pair<double, HighsDomainChange>& a,
             const std::pair<double, HighsDomainChange>& b) {
            return a.first > b.first;
          });

  auto localdom = mipsolver.mipdata_->domain;

  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);

  double currCutoff = kHighsInf;
  double lower_bound;

  lower_bound = mipsolver.mipdata_->lower_bound + mipsolver.mipdata_->feastol;

  for (const std::pair<double, HighsDomainChange>& domchg : lurkingBounds) {
    currCutoff = domchg.first;

    if (currCutoff <= lower_bound) break;

    if (localdom.isActive(domchg.second)) continue;
    localdom.changeBound(domchg.second);

    while (true) {
      localdom.propagate();
      if (localdom.infeasible()) {
        localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);

        double prev_lower_bound = mipsolver.mipdata_->lower_bound;

        mipsolver.mipdata_->lower_bound =
            std::max(mipsolver.mipdata_->lower_bound, currCutoff);

        const bool bound_change =
            mipsolver.mipdata_->lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          mipsolver.mipdata_->updatePrimalDualIntegral(
              prev_lower_bound, mipsolver.mipdata_->lower_bound,
              mipsolver.mipdata_->upper_bound, mipsolver.mipdata_->upper_bound);
        localdom.backtrack();
        if (localdom.getBranchDepth() == 0) break;
        neighbourhood.backtracked();
        continue;
      }
      break;
    }
    double fixingRate = neighbourhood.getFixingRate();
    if (fixingRate >= 0.5) break;
    // double gap = (currCutoff - mipsolver.mipdata_->lower_bound) /
    //             std::max(std::abs(mipsolver.mipdata_->lower_bound), 1.0);
    // if (gap < 0.001) break;
  }

  double fixingRate = neighbourhood.getFixingRate();
  if (fixingRate < 0.3) return;

  solveSubMip(*mipsolver.model_, mipsolver.mipdata_->firstrootbasis, fixingRate,
              localdom.col_lower_, localdom.col_upper_,
              500,  // std::max(50, int(0.05 *
                    // (mipsolver.mipdata_->num_leaves))),
              200 + mipsolver.mipdata_->num_nodes / 20, 12);
}